

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O0

String * __thiscall
sf::priv::ClipboardImpl::getStringImpl(String *__return_storage_ptr__,ClipboardImpl *this)

{
  bool bVar1;
  Int32 IVar2;
  long lVar3;
  Atom local_58;
  Time local_28;
  Clock local_20;
  Clock clock;
  ClipboardImpl *this_local;
  
  clock.m_startTime.m_microseconds = (Time)(Time)this;
  lVar3 = XGetSelectionOwner(this->m_display,this->m_clipboard);
  if (lVar3 == 0) {
    String::clear(&this->m_clipboardContents);
    String::String(__return_storage_ptr__,&this->m_clipboardContents);
  }
  else {
    processEvents();
    this->m_requestResponded = false;
    if (this->m_utf8String == 0) {
      local_58 = 0x1f;
    }
    else {
      local_58 = this->m_utf8String;
    }
    XConvertSelection(this->m_display,this->m_clipboard,local_58,this->m_targetProperty,
                      this->m_window,0);
    Clock::Clock(&local_20);
    while( true ) {
      bVar1 = false;
      if ((this->m_requestResponded & 1U) == 0) {
        local_28 = Clock::getElapsedTime(&local_20);
        IVar2 = Time::asMilliseconds(&local_28);
        bVar1 = IVar2 < 1000;
      }
      if (!bVar1) break;
      processEvents();
    }
    if ((this->m_requestResponded & 1U) == 0) {
      String::clear(&this->m_clipboardContents);
    }
    String::String(__return_storage_ptr__,&this->m_clipboardContents);
  }
  return __return_storage_ptr__;
}

Assistant:

String ClipboardImpl::getStringImpl()
{
    // Check if anybody owns the current selection
    if (XGetSelectionOwner(m_display, m_clipboard) == None)
    {
        m_clipboardContents.clear();

        return m_clipboardContents;
    }

    // Process any already pending events
    processEvents();

    m_requestResponded = false;

    // Request the current selection to be converted to UTF-8 (or STRING
    // if UTF-8 is not available) and written to our window property
    XConvertSelection(
        m_display,
        m_clipboard,
        (m_utf8String != None) ? m_utf8String : XA_STRING,
        m_targetProperty,
        m_window,
        CurrentTime
    );

    Clock clock;

    // Wait for a response for up to 1000ms
    while (!m_requestResponded && (clock.getElapsedTime().asMilliseconds() < 1000))
        processEvents();

    // If no response was received within the time period, clear our clipboard contents
    if (!m_requestResponded)
        m_clipboardContents.clear();

    return m_clipboardContents;
}